

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

kexinit_algorithm * ssh2_kexinit_addalg(kexinit_algorithm_list *list,char *name)

{
  size_t sVar1;
  _Bool _Var2;
  size_t sVar3;
  kexinit_algorithm *pkVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  ptrlen pl2;
  ptrlen pl1;
  
  sVar3 = strlen(name);
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    pkVar4 = list->algs;
    if (list->nalgs <= uVar6) {
      pkVar4 = (kexinit_algorithm *)safegrowarray(pkVar4,&list->algsize,0x20,list->nalgs,1,false);
      list->algs = pkVar4;
      sVar1 = list->nalgs;
      list->nalgs = sVar1 + 1;
      pkVar4[sVar1].name.ptr = name;
      pkVar4[sVar1].name.len = sVar3;
      return pkVar4 + sVar1;
    }
    pl2.len = sVar3;
    pl2.ptr = name;
    pl1.len = *(size_t *)((long)&(pkVar4->name).len + lVar5);
    pl1.ptr = *(void **)((long)&(pkVar4->name).ptr + lVar5);
    _Var2 = ptrlen_eq_ptrlen(pl1,pl2);
    if (_Var2) break;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x20;
  }
  return (kexinit_algorithm *)((long)&(list->algs->name).ptr + lVar5);
}

Assistant:

static struct kexinit_algorithm *ssh2_kexinit_addalg(
    struct kexinit_algorithm_list *list, const char *name)
{
    return ssh2_kexinit_addalg_pl(list, ptrlen_from_asciz(name));
}